

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_parser.c
# Opt level: O2

MPP_RET update_reference_list(Av1CodecContext *ctx)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  ushort uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  void *pvVar10;
  char *pcVar11;
  long lVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  byte bVar22;
  RK_S32 RVar23;
  long *plVar24;
  long lVar25;
  undefined4 *puVar26;
  ulong uVar27;
  
  pvVar10 = ctx->priv_data;
  pcVar11 = *(char **)((long)pvVar10 + 0x68);
  puVar26 = (undefined4 *)((long)pvVar10 + 0x1d3c4);
  for (lVar25 = 0; lVar25 != 8; lVar25 = lVar25 + 1) {
    if (((byte)pcVar11[0xb1] >> ((uint)lVar25 & 0x1f) & 1) != 0) {
      uVar8 = *(undefined4 *)(pcVar11 + 0x14);
      uVar9 = *(undefined4 *)((long)pvVar10 + 0x1bb4);
      bVar22 = pcVar11[0xc];
      lVar12 = *(long *)((long)pvVar10 + 0x58);
      *puVar26 = 1;
      puVar26[1] = uVar8;
      uVar8 = *(undefined4 *)((long)pvVar10 + 0x1ba4);
      uVar13 = *(undefined4 *)((long)pvVar10 + 0x1ba8);
      uVar14 = *(undefined4 *)((long)pvVar10 + 0x1bb0);
      puVar26[2] = *(undefined4 *)((long)pvVar10 + 0x1bac);
      puVar26[3] = uVar8;
      puVar26[4] = uVar13;
      puVar26[5] = uVar14;
      puVar26[6] = uVar9;
      puVar26[7] = (uint)bVar22;
      uVar7 = *(ushort *)(lVar12 + 0x247);
      *(ulong *)(puVar26 + 8) = (ulong)CONCAT14((char)(uVar7 >> 8),(uint)(uVar7 & 0xff));
      *(undefined8 *)(puVar26 + 10) = *(undefined8 *)((long)pvVar10 + 0x1b9c);
      memset(puVar26 + 0xc,0,0xcc);
      *(undefined8 *)(puVar26 + 0xc) = *(undefined8 *)(pcVar11 + 0x25c);
      *(undefined2 *)(puVar26 + 0xe) = *(undefined2 *)(pcVar11 + 0x266);
      uVar15 = *(undefined8 *)(pcVar11 + 0x185);
      uVar16 = *(undefined8 *)(pcVar11 + 0x18d);
      uVar17 = *(undefined8 *)(pcVar11 + 0x195);
      uVar18 = *(undefined8 *)(pcVar11 + 0x19d);
      uVar19 = *(undefined8 *)(pcVar11 + 0x1a5);
      uVar20 = *(undefined8 *)(pcVar11 + 0x1ad);
      uVar21 = *(undefined8 *)(pcVar11 + 0x1bd);
      *(undefined8 *)((long)puVar26 + 0x6a) = *(undefined8 *)(pcVar11 + 0x1b5);
      *(undefined8 *)((long)puVar26 + 0x72) = uVar21;
      *(undefined8 *)((long)puVar26 + 0x5a) = uVar19;
      *(undefined8 *)((long)puVar26 + 0x62) = uVar20;
      *(undefined8 *)((long)puVar26 + 0x4a) = uVar17;
      *(undefined8 *)((long)puVar26 + 0x52) = uVar18;
      *(undefined8 *)((long)puVar26 + 0x3a) = uVar15;
      *(undefined8 *)((long)puVar26 + 0x42) = uVar16;
      memcpy((void *)((long)puVar26 + 0x7a),pcVar11 + 0x1c6,0x80);
    }
    puVar26 = puVar26 + 0x3f;
  }
  if (*pcVar11 == '\0') {
    cVar1 = pcVar11[0xc1];
    cVar2 = pcVar11[0xc2];
    cVar3 = pcVar11[0xc5];
    cVar4 = pcVar11[0xbf];
    cVar5 = pcVar11[0xc3];
    cVar6 = pcVar11[0xc4];
    lVar25 = *(long *)((long)pvVar10 + 7000);
    *(uint *)(lVar25 + 0x10) = (uint)*(byte *)((long)pvVar10 + (long)pcVar11[0xc0] * 0x2f8 + 200);
    *(uint *)(lVar25 + 0x14) = (uint)*(byte *)((long)pvVar10 + (long)cVar1 * 0x2f8 + 200);
    *(uint *)(lVar25 + 0x18) = (uint)*(byte *)((long)pvVar10 + (long)cVar2 * 0x2f8 + 200);
    *(uint *)(lVar25 + 0x24) = (uint)*(byte *)((long)pvVar10 + (long)cVar3 * 0x2f8 + 200);
    *(uint *)(lVar25 + 0xc) = (uint)*(byte *)((long)pvVar10 + (long)cVar4 * 0x2f8 + 200);
    *(uint *)(lVar25 + 0x1c) = (uint)*(byte *)((long)pvVar10 + (long)cVar5 * 0x2f8 + 200);
    *(uint *)(lVar25 + 0x20) = (uint)*(byte *)((long)pvVar10 + (long)cVar6 * 0x2f8 + 200);
  }
  plVar24 = (long *)((long)pvVar10 + 0x398);
  uVar27 = 0;
  do {
    if (uVar27 == 8) {
      return MPP_OK;
    }
    bVar22 = pcVar11[0xb1];
    if (((byte)av1d_debug & 4) != 0) {
      _mpp_log_l(4,"av1d_parser","header->refresh_frame_flags = %d","update_reference_list",
                 (ulong)bVar22);
      bVar22 = pcVar11[0xb1];
    }
    if ((bVar22 >> ((uint)uVar27 & 0x1f) & 1) != 0) {
      if (((byte)av1d_debug & 4) != 0) {
        _mpp_log_l(4,"av1d_parser","av1 ref idx %d s->ref[%d].slot_index %d","update_reference_list"
                   ,uVar27 & 0xffffffff,uVar27 & 0xffffffff,(int)plVar24[-0x5d]);
      }
      if (*plVar24 != 0) {
        av1d_frame_unref(ctx,(AV1Frame *)(plVar24 + -0x5e));
      }
      RVar23 = av1d_frame_ref(ctx,(AV1Frame *)(plVar24 + -0x5e),(AV1Frame *)((long)pvVar10 + 0x1868)
                             );
      if (RVar23 < 0) {
        _mpp_log_l(2,"av1d_parser","Failed to update frame %d in reference list\n",
                   "update_reference_list",uVar27 & 0xffffffff);
        return MPP_NOK;
      }
    }
    uVar27 = uVar27 + 1;
    plVar24 = plVar24 + 0x5f;
  } while( true );
}

Assistant:

static MPP_RET update_reference_list(Av1CodecContext *ctx)
{
    AV1Context *s = ctx->priv_data;
    const AV1RawFrameHeader *header = s->raw_frame_header;
    MPP_RET ret = MPP_OK;
    RK_S32 i = 0;
    RK_S32 lst2_buf_idx;
    RK_S32 lst3_buf_idx;
    RK_S32 gld_buf_idx;
    RK_S32 alt_buf_idx;
    RK_S32 lst_buf_idx;
    RK_S32 bwd_buf_idx;
    RK_S32 alt2_buf_idx;

    for (i = 0; i < AV1_NUM_REF_FRAMES; i++) {
        if (header->refresh_frame_flags & (1 << i)) {
            s->ref_s[i] = (AV1ReferenceFrameState) {
                .valid = 1,
                 .frame_id = header->current_frame_id,
                  .upscaled_width = s->upscaled_width,
                   .frame_width = s->frame_width,
                    .frame_height = s->frame_height,
                     .render_width = s->render_width,
                      .render_height = s->render_height,
                       .frame_type = header->frame_type,
                        .subsampling_x = s->sequence_header->color_config.subsampling_x,
                         .subsampling_y = s->sequence_header->color_config.subsampling_y,
                          .bit_depth = s->bit_depth,
                           .order_hint = s->order_hint,
            };
            memcpy(s->ref_s[i].loop_filter_ref_deltas, header->loop_filter_ref_deltas,
                   sizeof(header->loop_filter_ref_deltas));
            memcpy(s->ref_s[i].loop_filter_mode_deltas, header->loop_filter_mode_deltas,
                   sizeof(header->loop_filter_mode_deltas));
            memcpy(s->ref_s[i].feature_enabled, header->feature_enabled,
                   sizeof(header->feature_enabled));
            memcpy(s->ref_s[i].feature_value, header->feature_value,
                   sizeof(header->feature_value));
        }
    }

    if (!header->show_existing_frame) {
        lst2_buf_idx = s->raw_frame_header->ref_frame_idx[AV1_REF_FRAME_LAST2 - AV1_REF_FRAME_LAST];
        lst3_buf_idx = s->raw_frame_header->ref_frame_idx[AV1_REF_FRAME_LAST3 - AV1_REF_FRAME_LAST];
        gld_buf_idx =  s->raw_frame_header->ref_frame_idx[AV1_REF_FRAME_GOLDEN - AV1_REF_FRAME_LAST];
        alt_buf_idx =  s->raw_frame_header->ref_frame_idx[AV1_REF_FRAME_ALTREF - AV1_REF_FRAME_LAST];
        lst_buf_idx =  s->raw_frame_header->ref_frame_idx[AV1_REF_FRAME_LAST - AV1_REF_FRAME_LAST];
        bwd_buf_idx =  s->raw_frame_header->ref_frame_idx[AV1_REF_FRAME_BWDREF - AV1_REF_FRAME_LAST];
        alt2_buf_idx = s->raw_frame_header->ref_frame_idx[AV1_REF_FRAME_ALTREF2 - AV1_REF_FRAME_LAST];

        s->cur_frame.ref->lst2_frame_offset = s->ref[lst2_buf_idx].order_hint;
        s->cur_frame.ref->lst3_frame_offset = s->ref[lst3_buf_idx].order_hint;
        s->cur_frame.ref->gld_frame_offset  = s->ref[gld_buf_idx].order_hint;
        s->cur_frame.ref->alt_frame_offset  = s->ref[alt_buf_idx].order_hint;
        s->cur_frame.ref->lst_frame_offset  = s->ref[lst_buf_idx].order_hint;
        s->cur_frame.ref->bwd_frame_offset  = s->ref[bwd_buf_idx].order_hint;
        s->cur_frame.ref->alt2_frame_offset = s->ref[alt2_buf_idx].order_hint;
    }

    for (i = 0; i < AV1_NUM_REF_FRAMES; i++) {
        av1d_dbg(AV1D_DBG_REF, "header->refresh_frame_flags = %d",
                 header->refresh_frame_flags);
        if (header->refresh_frame_flags & (1 << i)) {
            av1d_dbg(AV1D_DBG_REF, "av1 ref idx %d s->ref[%d].slot_index %d",
                     i, i, s->ref[i].slot_index);
            if (s->ref[i].ref)
                av1d_frame_unref(ctx, &s->ref[i]);

            if ((ret = av1d_frame_ref(ctx, &s->ref[i], &s->cur_frame)) < 0) {
                mpp_err_f("Failed to update frame %d in reference list\n", i);
                return ret;
            }
        }
    }
    return ret;
}